

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toScientificString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  div_t dVar5;
  int iVar6;
  int32_t start;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  UChar local_42 [9];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4fd8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if ((this->flags & 1U) != 0) {
    local_42[0] = L'-';
    UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
  }
  iVar6 = this->precision;
  if (iVar6 == 0) {
    UnicodeString::doAppend(__return_storage_ptr__,L"0E+0",0,-1);
    return __return_storage_ptr__;
  }
  uVar2 = this->scale;
  iVar3 = iVar6 + uVar2;
  if (this->lOptPos < (int)(iVar6 + uVar2)) {
    iVar3 = this->lOptPos;
  }
  uVar10 = ~uVar2 + iVar3;
  uVar7 = this->rOptPos;
  if (this->rOptPos < (int)uVar2) {
    uVar7 = uVar2;
  }
  if (this->usingBytes == true) {
    if ((int)uVar10 < iVar6 && -1 < (int)uVar10) {
      bVar4 = (this->fBCD).bcdBytes.ptr[uVar10];
      goto LAB_0021630f;
    }
  }
  else if (uVar10 < 0x10) {
    bVar4 = (byte)((this->fBCD).bcdLong >> ((char)uVar10 * '\x04' & 0x3fU)) & 0xf;
    goto LAB_0021630f;
  }
  bVar4 = 0;
LAB_0021630f:
  UnicodeString::append(__return_storage_ptr__,(char)bVar4 + 0x30);
  if ((int)(uVar7 - uVar2) < (int)uVar10) {
    local_42[0] = L'.';
    UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
    iVar6 = (iVar3 - uVar2) * 4 + -8;
    uVar8 = uVar10;
    while ((int)(uVar7 - uVar2) < (int)uVar8) {
      uVar9 = uVar8 - 1;
      if (this->usingBytes == true) {
        bVar4 = 0;
        if ((0 < (int)uVar8) && (bVar4 = 0, (int)uVar8 <= this->precision)) {
          bVar4 = (this->fBCD).bcdBytes.ptr[uVar9];
        }
      }
      else if (uVar9 < 0x10) {
        bVar4 = (byte)((this->fBCD).bcdLong >> ((byte)iVar6 & 0x3f)) & 0xf;
      }
      else {
        bVar4 = 0;
      }
      iVar6 = iVar6 + -4;
      UnicodeString::append(__return_storage_ptr__,(char)bVar4 + 0x30);
      uVar8 = uVar9;
    }
  }
  local_42[0] = L'E';
  UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
  dVar5.quot = uVar10 + this->scale;
  dVar5.rem = 0;
  if ((int)dVar5.quot < 0) {
    local_42[0] = L'-';
    UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
    dVar5.quot = -dVar5.quot;
    dVar5.rem = 0;
  }
  else {
    local_42[0] = L'+';
    UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
    if (dVar5.quot == 0) {
      local_42[0] = L'0';
      dVar5.quot = 0;
      dVar5.rem = 0;
      UnicodeString::doAppend(__return_storage_ptr__,local_42,0,1);
    }
  }
  sVar1 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    start = (__return_storage_ptr__->fUnion).fFields.fLength;
  }
  else {
    start = (int)sVar1 >> 5;
  }
  if (dVar5.quot != 0) {
    do {
      dVar5 = div(dVar5.quot,10);
      UnicodeString::replace(__return_storage_ptr__,start,0,dVar5.rem + 0x30);
    } while (0 < dVar5.quot);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toScientificString() const {
    U_ASSERT(!isApproximate);
    UnicodeString result;
    if (isNegative()) {
        result.append(u'-');
    }
    if (precision == 0) {
        result.append(u"0E+0", -1);
        return result;
    }
    // NOTE: It is not safe to add to lOptPos (aka maxInt) or subtract from
    // rOptPos (aka -maxFrac) due to overflow.
    int32_t upperPos = std::min(precision + scale, lOptPos) - scale - 1;
    int32_t lowerPos = std::max(scale, rOptPos) - scale;
    int32_t p = upperPos;
    result.append(u'0' + getDigitPos(p));
    if ((--p) >= lowerPos) {
        result.append(u'.');
        for (; p >= lowerPos; p--) {
            result.append(u'0' + getDigitPos(p));
        }
    }
    result.append(u'E');
    int32_t _scale = upperPos + scale;
    if (_scale < 0) {
        _scale *= -1;
        result.append(u'-');
    } else {
        result.append(u'+');
    }
    if (_scale == 0) {
        result.append(u'0');
    }
    int32_t insertIndex = result.length();
    while (_scale > 0) {
        std::div_t res = std::div(_scale, 10);
        result.insert(insertIndex, u'0' + res.rem);
        _scale = res.quot;
    }
    return result;
}